

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.hpp
# Opt level: O0

void __thiscall
qclab::qgates::iSWAP<std::complex<float>_>::iSWAP(iSWAP<std::complex<float>_> *this,int *qubits)

{
  int *qubits_local;
  iSWAP<std::complex<float>_> *this_local;
  
  QGate2<std::complex<float>_>::QGate2(&this->super_QGate2<std::complex<float>_>);
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0075bb08;
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[6])
            (this,qubits);
  return;
}

Assistant:

iSWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }